

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOper.h
# Opt level: O0

char * Abc_OperName(int Type)

{
  char *pcStack_10;
  int Type_local;
  
  if (Type == 0) {
    pcStack_10 = (char *)0x0;
  }
  else if (Type == 1) {
    pcStack_10 = "pi";
  }
  else if (Type == 2) {
    pcStack_10 = "po";
  }
  else if (Type == 3) {
    pcStack_10 = "ci";
  }
  else if (Type == 4) {
    pcStack_10 = "co";
  }
  else if (Type == 5) {
    pcStack_10 = "fon";
  }
  else if (Type == 6) {
    pcStack_10 = "box";
  }
  else if (Type == 0xb) {
    pcStack_10 = "buf";
  }
  else if (Type == 0xc) {
    pcStack_10 = "~";
  }
  else if (Type == 0x15) {
    pcStack_10 = "mux";
  }
  else if (Type == 0x16) {
    pcStack_10 = "maj";
  }
  else if (Type == 0xd) {
    pcStack_10 = "&";
  }
  else if (Type == 0xf) {
    pcStack_10 = "|";
  }
  else if (Type == 0x11) {
    pcStack_10 = "^";
  }
  else if (Type == 0xe) {
    pcStack_10 = "~&";
  }
  else if (Type == 0x10) {
    pcStack_10 = "~|";
  }
  else if (Type == 0x12) {
    pcStack_10 = "~^";
  }
  else if (Type == 0x1e) {
    pcStack_10 = "&";
  }
  else if (Type == 0x20) {
    pcStack_10 = "|";
  }
  else if (Type == 0x22) {
    pcStack_10 = "^";
  }
  else if (Type == 0x1f) {
    pcStack_10 = "~&";
  }
  else if (Type == 0x21) {
    pcStack_10 = "~|";
  }
  else if (Type == 0x23) {
    pcStack_10 = "~^";
  }
  else if (Type == 0x24) {
    pcStack_10 = "!";
  }
  else if (Type == 0x5f) {
    pcStack_10 = "=>";
  }
  else if (Type == 0x25) {
    pcStack_10 = "&&";
  }
  else if (Type == 0x27) {
    pcStack_10 = "||";
  }
  else if (Type == 0x29) {
    pcStack_10 = "^^";
  }
  else if (Type == 0x32) {
    pcStack_10 = "+";
  }
  else if (Type == 0x33) {
    pcStack_10 = "-";
  }
  else if (Type == 0x34) {
    pcStack_10 = "*";
  }
  else if (Type == 0x35) {
    pcStack_10 = "*";
  }
  else if (Type == 0x36) {
    pcStack_10 = "/";
  }
  else if (Type == 0x38) {
    pcStack_10 = "%";
  }
  else if (Type == 0x37) {
    pcStack_10 = "mod";
  }
  else if (Type == 0x39) {
    pcStack_10 = "**";
  }
  else if (Type == 0x3a) {
    pcStack_10 = "-";
  }
  else if (Type == 0x3b) {
    pcStack_10 = "sqrt";
  }
  else if (Type == 0x60) {
    pcStack_10 = "squar";
  }
  else if (Type == 0x42) {
    pcStack_10 = "==";
  }
  else if (Type == 0x43) {
    pcStack_10 = "!=";
  }
  else if (Type == 0x3e) {
    pcStack_10 = "<";
  }
  else if (Type == 0x41) {
    pcStack_10 = ">";
  }
  else if (Type == 0x3f) {
    pcStack_10 = "<=";
  }
  else if (Type == 0x40) {
    pcStack_10 = ">=";
  }
  else if (Type == 0x44) {
    pcStack_10 = "<<";
  }
  else if (Type == 0x45) {
    pcStack_10 = ">>";
  }
  else if (Type == 0x46) {
    pcStack_10 = "<<<";
  }
  else if (Type == 0x47) {
    pcStack_10 = ">>>";
  }
  else if (Type == 0x48) {
    pcStack_10 = "rotL";
  }
  else if (Type == 0x49) {
    pcStack_10 = "rotR";
  }
  else if (Type == 0x59) {
    pcStack_10 = "DFFRSE";
  }
  else if (Type == 0x5b) {
    pcStack_10 = "[:]";
  }
  else if (Type == 0x5c) {
    pcStack_10 = "{}";
  }
  else if (Type == 0x5d) {
    pcStack_10 = "zPad";
  }
  else if (Type == 0x5e) {
    pcStack_10 = "sExt";
  }
  else if (Type == 0x61) {
    pcStack_10 = "const";
  }
  else if (Type == 0x4d) {
    pcStack_10 = "table";
  }
  else if (Type == 0x4b) {
    pcStack_10 = "lut";
  }
  else {
    if (Type != 99) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/abcOper.h"
                    ,0xe7,"const char *Abc_OperName(int)");
    }
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static inline const char * Abc_OperName( int Type )
{
    if ( Type == ABC_OPER_NONE         )   return NULL;
    if ( Type == ABC_OPER_PI           )   return "pi";     
    if ( Type == ABC_OPER_PO           )   return "po";     
    if ( Type == ABC_OPER_CI           )   return "ci";     
    if ( Type == ABC_OPER_CO           )   return "co";     
    if ( Type == ABC_OPER_FON          )   return "fon";     
    if ( Type == ABC_OPER_BOX          )   return "box";    
    
    if ( Type == ABC_OPER_BIT_BUF      )   return "buf";    
    if ( Type == ABC_OPER_BIT_INV      )   return "~";      
    if ( Type == ABC_OPER_BIT_MUX      )   return "mux";    
    if ( Type == ABC_OPER_BIT_MAJ      )   return "maj";    
    if ( Type == ABC_OPER_BIT_AND      )   return "&";      
    if ( Type == ABC_OPER_BIT_OR       )   return "|";      
    if ( Type == ABC_OPER_BIT_XOR      )   return "^";      
    if ( Type == ABC_OPER_BIT_NAND     )   return "~&";     
    if ( Type == ABC_OPER_BIT_NOR      )   return "~|";     
    if ( Type == ABC_OPER_BIT_NXOR     )   return "~^";     

    if ( Type == ABC_OPER_RED_AND      )   return "&";      
    if ( Type == ABC_OPER_RED_OR       )   return "|";      
    if ( Type == ABC_OPER_RED_XOR      )   return "^";      
    if ( Type == ABC_OPER_RED_NAND     )   return "~&";     
    if ( Type == ABC_OPER_RED_NOR      )   return "~|";     
    if ( Type == ABC_OPER_RED_NXOR     )   return "~^";     

    if ( Type == ABC_OPER_LOGIC_NOT    )   return "!";      
    if ( Type == ABC_OPER_LOGIC_IMPL   )   return "=>";     
    if ( Type == ABC_OPER_LOGIC_AND    )   return "&&";     
    if ( Type == ABC_OPER_LOGIC_OR     )   return "||";     
    if ( Type == ABC_OPER_LOGIC_XOR    )   return "^^";   

    if ( Type == ABC_OPER_ARI_ADD      )   return "+";      
    if ( Type == ABC_OPER_ARI_SUB      )   return "-";      
    if ( Type == ABC_OPER_ARI_MUL      )   return "*";      
    if ( Type == ABC_OPER_ARI_SMUL     )   return "*";      
    if ( Type == ABC_OPER_ARI_DIV      )   return "/";      
    if ( Type == ABC_OPER_ARI_REM      )   return "%";      
    if ( Type == ABC_OPER_ARI_MOD      )   return "mod";    
    if ( Type == ABC_OPER_ARI_POW      )   return "**";     
    if ( Type == ABC_OPER_ARI_MIN      )   return "-";      
    if ( Type == ABC_OPER_ARI_SQRT     )   return "sqrt";   
    if ( Type == ABC_OPER_ARI_SQUARE   )   return "squar";  
    
    if ( Type == ABC_OPER_COMP_EQU     )   return "==";     
    if ( Type == ABC_OPER_COMP_NOTEQU  )   return "!=";     
    if ( Type == ABC_OPER_COMP_LESS    )   return "<";      
    if ( Type == ABC_OPER_COMP_MORE    )   return ">";      
    if ( Type == ABC_OPER_COMP_LESSEQU )   return "<=";     
    if ( Type == ABC_OPER_COMP_MOREEQU )   return ">=";     

    if ( Type == ABC_OPER_SHIFT_L      )   return "<<";     
    if ( Type == ABC_OPER_SHIFT_R      )   return ">>";     
    if ( Type == ABC_OPER_SHIFT_LA     )   return "<<<";    
    if ( Type == ABC_OPER_SHIFT_RA     )   return ">>>";    
    if ( Type == ABC_OPER_SHIFT_ROTL   )   return "rotL";   
    if ( Type == ABC_OPER_SHIFT_ROTR   )   return "rotR";   

    if ( Type == ABC_OPER_DFFRSE       )   return "DFFRSE";    

    if ( Type == ABC_OPER_SLICE        )   return "[:]";    
    if ( Type == ABC_OPER_CONCAT       )   return "{}";     
    if ( Type == ABC_OPER_ZEROPAD      )   return "zPad";   
    if ( Type == ABC_OPER_SIGNEXT      )   return "sExt";   

    if ( Type == ABC_OPER_CONST        )   return "const";  
    if ( Type == ABC_OPER_TABLE        )   return "table";  
    if ( Type == ABC_OPER_LUT          )   return "lut";  
    if ( Type == ABC_OPER_LAST         )   return NULL;     
    assert( 0 );
    return NULL;
}